

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpginput.cc
# Opt level: O0

void __thiscall JpegInput::readHeader(JpegInput *this)

{
  uint32_t h;
  uint32_t w;
  void *pvVar1;
  undefined8 uVar2;
  runtime_error *prVar3;
  size_t sVar4;
  v10 *this_00;
  long in_RDI;
  undefined1 in_stack_00000038 [16];
  string_view in_stack_00000048;
  jpgd_status errorCode;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 uVar5;
  uint32_t in_stack_fffffffffffffdd4;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffddc;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 uVar7;
  uint32_t in_stack_fffffffffffffde4;
  undefined4 in_stack_fffffffffffffdec;
  uint32_t in_stack_fffffffffffffdf4;
  ImageSpec *this_01;
  khr_df_sample_datatype_qualifiers_e in_stack_fffffffffffffe18;
  khr_df_transfer_e in_stack_fffffffffffffe20;
  khr_df_primaries_e in_stack_fffffffffffffe28;
  khr_df_model_e in_stack_fffffffffffffe30;
  size_t *psVar8;
  khr_df_flags_e in_stack_fffffffffffffe38;
  ImageSpec local_19b;
  undefined1 local_111;
  char *local_110;
  size_t local_108;
  string local_100 [32];
  anon_union_16_16_d721ec3a_for_value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_1
  local_e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_jpgd::jpgd_status>
  *local_c8 [3];
  undefined8 local_b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_jpgd::jpgd_status>
  **local_a8;
  char *local_a0;
  anon_union_16_16_d721ec3a_for_value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_1
  *local_90;
  char *local_88;
  size_t sStack_80;
  string *local_78;
  char *local_70;
  char **local_68;
  char **local_60;
  char *local_58;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_jpgd::jpgd_status>
  **local_48;
  undefined8 *local_40;
  char *local_38;
  char **local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_jpgd::jpgd_status>
  **local_28;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_jpgd::jpgd_status>
  **local_20;
  undefined8 local_18;
  undefined8 *local_10;
  char *local_8;
  
  pvVar1 = operator_new(0x34d8);
  this_00 = (v10 *)(in_RDI + 0x2d0);
  jpgd::jpeg_decoder::jpeg_decoder
            ((jpeg_decoder *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
             (jpeg_decoder_stream *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
             in_stack_fffffffffffffdd4);
  *(void **)(in_RDI + 0x2f0) = pvVar1;
  local_e0.int_value = jpgd::jpeg_decoder::get_error_code(*(jpeg_decoder **)(in_RDI + 0x2f0));
  if (local_e0.int_value == JPGD_SUCCESS) {
    h = jpgd::jpeg_decoder::get_width(*(jpeg_decoder **)(in_RDI + 0x2f0));
    w = jpgd::jpeg_decoder::get_height(*(jpeg_decoder **)(in_RDI + 0x2f0));
    this_01 = &local_19b;
    ImageSpec::Origin::Origin((Origin *)this_01,'\0','\0');
    jpgd::jpeg_decoder::get_num_components(*(jpeg_decoder **)(in_RDI + 0x2f0));
    uVar7 = 1;
    uVar6 = 2;
    uVar5 = 0;
    ImageSpec::ImageSpec
              (this_01,w,h,in_stack_fffffffffffffdf4,(Origin *)CONCAT44(in_stack_fffffffffffffdec,1)
               ,in_stack_fffffffffffffde4,(int)&local_19b + 3,in_stack_fffffffffffffe18,
               in_stack_fffffffffffffe20,in_stack_fffffffffffffe28,in_stack_fffffffffffffe30,
               in_stack_fffffffffffffe38);
    std::vector<ImageInput::imageInfo,std::allocator<ImageInput::imageInfo>>::
    emplace_back<ImageSpec,ImageInputFormatType>
              ((vector<ImageInput::imageInfo,_std::allocator<ImageInput::imageInfo>_> *)
               CONCAT44(in_stack_fffffffffffffde4,uVar7),
               (ImageSpec *)CONCAT44(in_stack_fffffffffffffddc,uVar6),
               (ImageInputFormatType *)CONCAT44(in_stack_fffffffffffffdd4,uVar5));
    ImageSpec::~ImageSpec((ImageSpec *)0x1a1b60);
    return;
  }
  if (local_e0.int_value == JPGD_NOT_JPEG) {
    uVar2 = __cxa_allocate_exception(0x10);
    ImageInput::different_format::different_format
              ((different_format *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    __cxa_throw(uVar2,&ImageInput::different_format::typeinfo,
                ImageInput::different_format::~different_format);
  }
  if (local_e0.int_value == JPGD_NOTENOUGHMEM) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"JPEG decoder out of memory");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_111 = 1;
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_68 = &local_110;
  local_70 = "JPEG decode failed: {}";
  local_38 = "JPEG decode failed: {}";
  local_110 = "JPEG decode failed: {}";
  psVar8 = &local_108;
  local_30 = local_68;
  sVar4 = std::char_traits<char>::length((char_type *)0x1a1860);
  *psVar8 = sVar4;
  local_8 = local_70;
  local_78 = local_100;
  local_88 = local_110;
  sStack_80 = local_108;
  local_90 = &local_e0;
  local_60 = &local_88;
  local_a0 = local_110;
  local_58 = local_a0;
  local_c8[0] = fmt::v10::
                make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,jpgd::jpgd_status>
                          ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_jpgd::jpgd_status>
                            *)&local_90->string,this_00,(jpgd_status *)local_78);
  local_40 = &local_b0;
  local_48 = local_c8;
  local_18 = 0xf;
  local_b0 = 0xf;
  local_28 = local_48;
  local_20 = local_48;
  local_10 = local_40;
  local_a8 = local_48;
  fmt::v10::vformat_abi_cxx11_(in_stack_00000048,(format_args)in_stack_00000038);
  std::runtime_error::runtime_error(prVar3,local_100);
  local_111 = 0;
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
JpegInput::readHeader()
{
    pJd = new jpeg_decoder(&jstream, jpeg_decoder::cFlagLinearChromaFiltering);
    jpgd_status errorCode = pJd->get_error_code();

    if (errorCode != JPGD_SUCCESS) {
        if (errorCode == JPGD_NOT_JPEG) {
            throw different_format();
        } else if (errorCode == JPGD_NOTENOUGHMEM) {
            throw std::runtime_error("JPEG decoder out of memory");
        } else {
            throw std::runtime_error(
                fmt::format("JPEG decode failed: {}", errorCode)
            );
        }
    }
    // At this point we cannot use
    // - jd.get_bytes_per_pixel
    // - jd.get_bytes_per_scan_line
    // because the underlying variables are not initialized until
    // begin_decoding is called. In any case these are not helpful as they
    // return what the decode() method will return not what is in the file.

    images.emplace_back(ImageSpec(pJd->get_width(), pJd->get_height(), 1,
                                ImageSpec::Origin(ImageSpec::Origin::eLeft, ImageSpec::Origin::eTop),
                                pJd->get_num_components(), 8, // component bit length
                                static_cast<khr_df_sample_datatype_qualifiers_e>(0),
                                KHR_DF_TRANSFER_SRGB,
                                KHR_DF_PRIMARIES_BT709),
                        ImageInputFormatType::jpg);
}